

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_short,10u>,Counter<unsigned_char,4u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  uint original;
  uint uVar6;
  byte bVar7;
  uint recent;
  uint uVar8;
  uint uVar9;
  ushort uVar10;
  
  iVar4 = 0;
  for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
    bVar7 = ((byte)uVar6 & 0xf) * '\x02';
    uVar3 = (ushort)uVar6;
    uVar1 = uVar3 & 0xf;
    uVar9 = uVar6;
    for (uVar8 = 0; uVar8 != 0x20; uVar8 = uVar8 + 1) {
      if (uVar8 < uVar6) {
        if ((int)uVar9 < 8 - bias) {
LAB_00101c6f:
          uVar2 = (ushort)uVar8;
          uVar5 = uVar2 & 0x10 | uVar1;
          uVar10 = uVar2 & 0xf;
          if (uVar10 < uVar1) {
            if ((ushort)(8 - bias) <= (ushort)(uVar1 - uVar10)) {
              uVar5 = uVar5 + 0x3f0 & 0x3ff;
            }
          }
          else if ((ushort)(bias + 8) < (ushort)(uVar10 - uVar1)) {
            uVar5 = uVar5 + 0x10;
          }
          if ((uVar5 != uVar3) ||
             ((bias == 0 &&
              ((((ushort)uVar9 & 0xf) + (bVar7 >> 4 & 1) * -0x10 + uVar2 & 0x3ff) != uVar3))))
          goto LAB_00101d00;
        }
      }
      else if ((int)(iVar4 + uVar8) <= bias + 8) goto LAB_00101c6f;
      bVar7 = bVar7 - 2;
      uVar9 = uVar9 - 1;
    }
    iVar4 = iVar4 + -1;
  }
LAB_00101d00:
  return 0x1f < uVar6;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}